

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

ON__UINT32 __thiscall ON_MeshNgon::CRC32(ON_MeshNgon *this)

{
  ON__UINT32 local_14;
  ON__UINT32 crc;
  ON_MeshNgon *this_local;
  
  local_14 = 0;
  if ((this->m_Vcount != 0) && (this->m_vi != (uint *)0x0)) {
    local_14 = ON_CRC32(0,(ulong)this->m_Vcount << 2,this->m_vi);
  }
  if ((this->m_Fcount != 0) && (this->m_fi != (uint *)0x0)) {
    local_14 = ON_CRC32(local_14,(ulong)this->m_Fcount << 2,this->m_fi);
  }
  return local_14;
}

Assistant:

ON__UINT32 ON_MeshNgon::CRC32() const
{
  ON__UINT32 crc = 0;
  if ( m_Vcount > 0 && m_vi )
    crc = ON_CRC32(crc,m_Vcount*sizeof(m_vi[0]),m_vi);  
  if ( m_Fcount > 0 && m_fi )
    crc = ON_CRC32(crc,m_Fcount*sizeof(m_fi[0]),m_fi);
  return crc;
}